

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
helics::Input::getValue_impl<std::vector<double,std::allocator<double>>>
          (void *param_1,Input *param_2)

{
  vector<double,_std::allocator<double>_> *val;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2a836e);
  getValue_impl<std::vector<double,std::allocator<double>>>(param_2,param_1);
  return (vector<double,_std::allocator<double>_> *)param_1;
}

Assistant:

X getValue_impl(std::integral_constant<int, primaryType> /*V*/)
    {
        X val;  // NOLINT
        getValue_impl(std::integral_constant<int, primaryType>(), val);
        return val;
    }